

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

args * djb::tab_r::extract_beckmann_args(args *__return_storage_ptr__,tab_r *tab)

{
  tab_r *this;
  float fVar1;
  float_t fVar2;
  float fVar3;
  float_t fVar4;
  double dVar5;
  args local_a0;
  undefined1 local_54 [8];
  vec3 wm;
  float_t z_m;
  float_t zm;
  float_t tm;
  float_t u;
  int i;
  float_t alpha;
  double nint;
  double local_20;
  double du;
  tab_r *ptStack_10;
  int cnt;
  tab_r *tab_local;
  
  du._4_4_ = 0x200;
  ptStack_10 = tab;
  nint._4_4_ = m_pi();
  fVar1 = sqr<float>((float *)((long)&nint + 4));
  local_20 = (double)fVar1 / (double)du._4_4_;
  _i = 0.0;
  for (tm = 0.0; (int)tm < du._4_4_; tm = (float_t)((int)tm + 1)) {
    zm = (float)(int)tm / (float)du._4_4_;
    fVar1 = sqr<float>(&zm);
    fVar2 = m_pi();
    fVar1 = (fVar1 * fVar2) / 2.0;
    dVar5 = std::cos((double)(ulong)(uint)fVar1);
    wm.z = SUB84(dVar5,0);
    dVar5 = std::sin((double)(ulong)(uint)fVar1);
    wm.y = SUB84(dVar5,0);
    vec3::vec3((vec3 *)local_54,wm.y,0.0,wm.z);
    fVar2 = zm;
    fVar3 = sqr<float>(&wm.y);
    dVar5 = std::tan((double)(ulong)(uint)fVar1);
    this = ptStack_10;
    microfacet::args::standard();
    fVar4 = microfacet::ndf((microfacet *)this,(vec3 *)local_54,&local_a0);
    _i = (double)(fVar2 * fVar3 * SUB84(dVar5,0) * fVar4) + _i;
  }
  _i = local_20 * _i;
  dVar5 = sqrt(_i * 2.0);
  u = (float_t)dVar5;
  fprintf(_stdout,"djb_verbose: Beckmann_alpha = %.9f\n",(double)u);
  microfacet::args::isotropic(__return_storage_ptr__,u);
  return __return_storage_ptr__;
}

Assistant:

microfacet::args tab_r::extract_beckmann_args(const tab_r &tab)
{
	int cnt = 512;
	double du = (double)sqr(m_pi()) / cnt;
	double nint = 0;
	float_t alpha;

	for (int i = 0; i < cnt; ++i) {
		float_t u = (float_t)i / cnt;
		float_t tm = sqr(u) * m_pi() / 2;
		float_t zm = cos(tm), z_m = sin(tm);
		vec3 wm = vec3(z_m, 0, zm);

		nint+= (double)(u * sqr(z_m) * tan(tm) * tab.ndf(wm));
	}
	nint*= du;
	alpha = sqrt(2 * nint);

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: Beckmann_alpha = %.9f\n", (double)alpha);
#endif
	return microfacet::args::isotropic(alpha);
}